

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

double __thiscall r_exec::Group::update_act(Group *this,View *v)

{
  ulong uVar1;
  uint16_t uVar2;
  int iVar3;
  double *pdVar4;
  _Mem *p_Var5;
  View *pVVar6;
  Group *pGVar7;
  Code *pCVar8;
  Mem *pMVar9;
  uint16_t uVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,0x1b);
  fVar12 = (float)r_code::Atom::asFloat();
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,0x1a);
  fVar13 = (float)r_code::Atom::asFloat();
  dVar14 = r_exec::View::update_act(v,(double)fVar12,(double)fVar13);
  this->avg_act = this->avg_act + dVar14;
  if (dVar14 < this->high_act || dVar14 == this->high_act) {
    if (this->low_act <= dVar14) goto LAB_0016da90;
    pdVar4 = &this->low_act;
  }
  else {
    pdVar4 = &this->high_act;
  }
  *pdVar4 = dVar14;
LAB_0016da90:
  this->act_updates = this->act_updates + 1;
  iVar3 = (*(v->super_View).super__Object._vptr__Object[2])();
  if ((char)iVar3 == '\0') {
    uVar1 = v->periods_at_high_act;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[4])(this,0x1c);
    fVar12 = (float)r_code::Atom::asFloat();
    if ((fVar12 != (float)uVar1) || (NAN(fVar12) || NAN((float)uVar1))) {
      uVar1 = v->periods_at_low_act;
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(this,0x1c);
      fVar12 = (float)r_code::Atom::asFloat();
      if ((fVar12 == (float)uVar1) && (!NAN(fVar12) && !NAN((float)uVar1))) {
        v->periods_at_low_act = 0;
        uVar2 = get_ntf_grp_count(this);
        if (uVar2 != 0) {
          uVar10 = 1;
          do {
            p_Var5 = (_Mem *)r_code::Mem::Get();
            pVVar6 = (View *)operator_new(0x100);
            pGVar7 = get_ntf_grp(this,uVar10);
            pCVar8 = (Code *)operator_new(0x150);
            pMVar9 = (Mem *)r_code::Mem::Get();
            MkLowAct::MkLowAct((MkLowAct *)pCVar8,pMVar9,(Code *)(v->super_View).object.object);
            NotificationView::NotificationView
                      ((NotificationView *)pVVar6,(Code *)this,(Code *)pGVar7,pCVar8);
            _Mem::inject_notification(p_Var5,pVVar6,false);
            bVar11 = uVar10 != uVar2;
            uVar10 = uVar10 + 1;
          } while (bVar11);
        }
      }
    }
    else {
      v->periods_at_high_act = 0;
      uVar2 = get_ntf_grp_count(this);
      if (uVar2 != 0) {
        uVar10 = 1;
        do {
          p_Var5 = (_Mem *)r_code::Mem::Get();
          pVVar6 = (View *)operator_new(0x100);
          pGVar7 = get_ntf_grp(this,uVar10);
          pCVar8 = (Code *)operator_new(0x150);
          pMVar9 = (Mem *)r_code::Mem::Get();
          MkHighAct::MkHighAct((MkHighAct *)pCVar8,pMVar9,(Code *)(v->super_View).object.object);
          NotificationView::NotificationView
                    ((NotificationView *)pVVar6,(Code *)this,(Code *)pGVar7,pCVar8);
          _Mem::inject_notification(p_Var5,pVVar6,false);
          bVar11 = uVar10 != uVar2;
          uVar10 = uVar10 + 1;
        } while (bVar11);
      }
    }
  }
  return dVar14;
}

Assistant:

double Group::update_act(View *v)
{
    double act = v->update_act(get_low_act_thr(), get_high_act_thr());
    avg_act += act;

    if (act > high_act) {
        high_act = act;
    } else if (act < low_act) {
        low_act = act;
    }

    ++act_updates;

    if (!v->isNotification()) {
        if (v->periods_at_high_act == get_act_ntf_prd()) {
            v->periods_at_high_act = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkHighAct(_Mem::Get(), v->object)), false);
            }
        } else if (v->periods_at_low_act == get_act_ntf_prd()) {
            v->periods_at_low_act = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowAct(_Mem::Get(), v->object)), false);
            }
        }
    }

    return act;
}